

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitMatrixIO.cpp
# Opt level: O3

string * __thiscall
ZXing::ToString_abi_cxx11_
          (string *__return_storage_ptr__,ZXing *this,BitMatrix *matrix,char one,char zero,
          bool addSpace,bool printAsCString)

{
  int iVar1;
  int iVar2;
  char cVar3;
  int iVar4;
  long lVar5;
  int local_54;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  iVar4 = 0;
  local_54 = 1;
  while (iVar4 < *(int *)(this + 4)) {
    cVar3 = (char)__return_storage_ptr__;
    if (addSpace) {
      std::__cxx11::string::push_back(cVar3);
    }
    iVar1 = *(int *)this;
    iVar2 = iVar1 * iVar4;
    iVar4 = iVar4 + 1;
    if (iVar2 != iVar1 * iVar4) {
      lVar5 = (long)iVar2;
      do {
        std::__cxx11::string::push_back(cVar3);
        if (zero != '\0') {
          std::__cxx11::string::push_back(cVar3);
        }
        lVar5 = lVar5 + 1;
      } while (iVar1 * local_54 != lVar5);
    }
    if (addSpace) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    local_54 = local_54 + 1;
    std::__cxx11::string::push_back(cVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ToString(const BitMatrix& matrix, char one, char zero, bool addSpace, bool printAsCString)
{
	std::string result;
	result.reserve((addSpace ? 2 : 1) * (matrix.width() * matrix.height()) + matrix.height());
	for (int y = 0; y < matrix.height(); ++y) {
		if (printAsCString)
			result += '"';
		for (auto bit : matrix.row(y)) {
			result += bit ? one : zero;
			if (addSpace)
				result += ' ';
		}
		if (printAsCString)
			result += "\\n\"";
		result += '\n';
	}
	return result;
}